

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_infohashes.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::sample_infohashes_observer::reply(sample_infohashes_observer *this,msg *m)

{
  bdecode_node *this_00;
  bool bVar1;
  uint32_t uVar2;
  udp p;
  int iVar3;
  dht_observer *pdVar4;
  traversal_algorithm *ptVar5;
  node *pnVar6;
  size_t sVar7;
  int64_t iVar8;
  unsigned_long __n;
  digest32<160L> *__dest;
  char *pcVar9;
  size_type sVar10;
  sample_infohashes *this_01;
  char **in;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_280;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_268;
  duration<long,_std::ratio<1L,_1L>_> local_250;
  time_duration local_248;
  digest32<160L> local_240;
  allocator<libtorrent::digest32<160L>_> local_229;
  undefined1 local_228 [8];
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> v;
  undefined1 local_200 [8];
  bdecode_node samples;
  int local_1b0;
  int64_t num;
  int64_t local_198;
  int64_t interval;
  undefined1 local_180 [8];
  bdecode_node id;
  undefined1 local_138 [8];
  node_endpoint nep;
  char *end;
  char *ptr;
  undefined1 local_e8 [8];
  bdecode_node n;
  char *nodes_key;
  int protocol_size;
  udp protocol;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  nodes;
  string_view local_68;
  undefined1 local_58 [8];
  bdecode_node r;
  msg *m_local;
  sample_infohashes_observer *this_local;
  
  this_00 = m->message;
  r._56_8_ = m;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"r");
  bdecode_node::dict_find_dict((bdecode_node *)local_58,this_00,local_68);
  bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_58);
  if (bVar1) {
    ::std::
    vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
    ::vector((vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
              *)&protocol_size);
    ptVar5 = observer::algorithm((observer *)this);
    pnVar6 = traversal_algorithm::get_node(ptVar5);
    p = dht::node::protocol(pnVar6);
    sVar7 = libtorrent::aux::address_size<libtorrent::udp>(p);
    ptVar5 = observer::algorithm((observer *)this);
    pnVar6 = traversal_algorithm::get_node(ptVar5);
    n._56_8_ = dht::node::protocol_nodes_key(pnVar6);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&ptr,(char *)n._56_8_);
    bdecode_node::dict_find_string((bdecode_node *)local_e8,(bdecode_node *)local_58,_ptr);
    bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_e8);
    if (bVar1) {
      pcVar9 = bdecode_node::string_ptr((bdecode_node *)local_e8);
      end = pcVar9;
      iVar3 = bdecode_node::string_length((bdecode_node *)local_e8);
      nep.ep.impl_.data_._20_8_ = pcVar9 + iVar3;
      while (in = (char **)(long)((int)sVar7 + 0x16),
            (long)in <= nep.ep.impl_.data_._20_8_ - (long)end) {
        id._60_4_ = p;
        read_node_endpoint<char_const*&>
                  ((node_endpoint *)local_138,(dht *)(ulong)(uint)p.super_udp.family_,(udp)(int)&end
                   ,in);
        ::std::
        vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
        ::
        emplace_back<libtorrent::digest32<160l>&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>&>
                  ((vector<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>,std::allocator<std::pair<libtorrent::digest32<160l>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>
                    *)&protocol_size,(digest32<160L> *)local_138,
                   (basic_endpoint<boost::asio::ip::udp> *)(nep.id.m_number._M_elems + 3));
      }
    }
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&interval,"id");
    bdecode_node::dict_find_string((bdecode_node *)local_180,(bdecode_node *)local_58,_interval);
    bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_180);
    if ((bVar1) && (iVar3 = bdecode_node::string_length((bdecode_node *)local_180), iVar3 == 0x14))
    {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&num,"interval");
      local_198 = bdecode_node::dict_find_int_value((bdecode_node *)local_58,_num,-1);
      if ((local_198 < 0) || (0x5460 < local_198)) {
        pdVar4 = observer::get_observer((observer *)this);
        ptVar5 = observer::algorithm((observer *)this);
        uVar2 = traversal_algorithm::id(ptVar5);
        (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar4,4,"[%u] wrong or missing interval value",(ulong)uVar2);
        observer::timeout((observer *)this);
      }
      else {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&samples.m_size,"num");
        iVar8 = bdecode_node::dict_find_int_value
                          ((bdecode_node *)local_58,stack0xfffffffffffffe40,-1);
        if ((iVar8 < 0) || (iVar3 = ::std::numeric_limits<int>::max(), iVar3 < iVar8)) {
          pdVar4 = observer::get_observer((observer *)this);
          ptVar5 = observer::algorithm((observer *)this);
          uVar2 = traversal_algorithm::id(ptVar5);
          (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar4,4,"[%u] wrong or missing num value",(ulong)uVar2);
          observer::timeout((observer *)this);
        }
        else {
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     &v.
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"samples");
          bdecode_node::dict_find_string
                    ((bdecode_node *)local_200,(bdecode_node *)local_58,stack0xfffffffffffffdf0);
          bVar1 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_200);
          if ((bVar1) &&
             (iVar3 = bdecode_node::string_length((bdecode_node *)local_200), iVar3 % 0x14 == 0)) {
            iVar3 = bdecode_node::string_length((bdecode_node *)local_200);
            __n = libtorrent::aux::numeric_cast<unsigned_long,int,void>(iVar3 / 0x14);
            ::std::allocator<libtorrent::digest32<160L>_>::allocator(&local_229);
            ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::vector((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      *)local_228,__n,&local_229);
            ::std::allocator<libtorrent::digest32<160L>_>::~allocator(&local_229);
            __dest = ::std::
                     vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ::data((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             *)local_228);
            pcVar9 = bdecode_node::string_ptr((bdecode_node *)local_200);
            sVar10 = ::std::
                     vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ::size((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             *)local_228);
            memcpy(__dest,pcVar9,sVar10 * 0x14);
            this_01 = (sample_infohashes *)observer::algorithm((observer *)this);
            pcVar9 = bdecode_node::string_ptr((bdecode_node *)local_180);
            digest32<160L>::digest32(&local_240,pcVar9);
            ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
                      ((duration<long,std::ratio<1l,1l>> *)&local_250,&local_198);
            ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
            duration<long,std::ratio<1l,1l>,void>
                      ((duration<long,std::ratio<1l,1000000000l>> *)&local_248,&local_250);
            local_1b0 = (int)iVar8;
            ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::vector(&local_268,
                     (vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      *)local_228);
            ::std::
            vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            ::vector(&local_280,
                     (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                      *)&protocol_size);
            sample_infohashes::got_samples
                      (this_01,&local_240,local_248,local_1b0,&local_268,&local_280);
            ::std::
            vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
            ::~vector(&local_280);
            ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::~vector(&local_268);
            ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::~vector((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                       *)local_228);
          }
          else {
            pdVar4 = observer::get_observer((observer *)this);
            ptVar5 = observer::algorithm((observer *)this);
            uVar2 = traversal_algorithm::id(ptVar5);
            (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                      (pdVar4,4,"[%u] wrong or missing samples value",(ulong)uVar2);
            observer::timeout((observer *)this);
          }
          traversal_observer::reply(&this->super_traversal_observer,(msg *)r._56_8_);
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
          ::operator|=(&(this->super_traversal_observer).super_observer.flags,
                       (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)0x80
                      );
          bdecode_node::~bdecode_node((bdecode_node *)local_200);
        }
      }
    }
    else {
      pdVar4 = observer::get_observer((observer *)this);
      ptVar5 = observer::algorithm((observer *)this);
      uVar2 = traversal_algorithm::id(ptVar5);
      (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
                (pdVar4,4,"[%u] wrong or missing id value",(ulong)uVar2);
      observer::timeout((observer *)this);
    }
    bdecode_node::~bdecode_node((bdecode_node *)local_180);
    bdecode_node::~bdecode_node((bdecode_node *)local_e8);
    ::std::
    vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
    ::~vector((vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
               *)&protocol_size);
  }
  else {
    pdVar4 = observer::get_observer((observer *)this);
    ptVar5 = observer::algorithm((observer *)this);
    uVar2 = traversal_algorithm::id(ptVar5);
    (*(pdVar4->super_dht_logger)._vptr_dht_logger[1])
              (pdVar4,4,"[%u] missing response dict",(ulong)uVar2);
    observer::timeout((observer *)this);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_58);
  return;
}

Assistant:

void sample_infohashes_observer::reply(msg const& m)
{
	bdecode_node r = m.message.dict_find_dict("r");
	if (!r)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] missing response dict"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	// look for nodes
	std::vector<std::pair<sha1_hash, udp::endpoint>> nodes;
	udp const protocol = algorithm()->get_node().protocol();
	int const protocol_size = int(aux::address_size(protocol));
	char const* nodes_key = algorithm()->get_node().protocol_nodes_key();
	bdecode_node const n = r.dict_find_string(nodes_key);
	if (n)
	{
		char const* ptr = n.string_ptr();
		char const* end = ptr + n.string_length();

		while (end - ptr >= 20 + protocol_size + 2)
		{
			node_endpoint nep = read_node_endpoint(protocol, ptr);
			nodes.emplace_back(nep.id, nep.ep);
		}
	}

	bdecode_node const id = r.dict_find_string("id");
	if (!id || id.string_length() != 20)
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing id value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	std::int64_t const interval = r.dict_find_int_value("interval", -1);
	if (interval < 0 || interval > 21600) // TODO: put constant in a common place
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing interval value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	std::int64_t const num = r.dict_find_int_value("num", -1);
	if (num < 0 || num > std::numeric_limits<int>::max())
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing num value"
			, algorithm()->id());
#endif
		timeout();
		return;
	}

	bdecode_node samples = r.dict_find_string("samples");
	if (samples && (samples.string_length() % 20 == 0))
	{
		std::vector<sha1_hash> v(aux::numeric_cast<std::size_t>(samples.string_length() / 20));
		std::memcpy(v.data(), samples.string_ptr(), v.size() * 20);

		static_cast<sample_infohashes*>(algorithm())->got_samples(
			node_id(id.string_ptr()), seconds(interval), int(num), std::move(v), std::move(nodes));
	}
	else
	{
#ifndef TORRENT_DISABLE_LOGGING
		get_observer()->log(dht_logger::traversal, "[%u] wrong or missing samples value"
			, algorithm()->id());
#endif
		timeout();
	}

	// we deliberately do not call
	traversal_observer::reply(m);
	// this is necessary to play nice with
	// observer::abort(), observer::done() and observer::timeout()
	flags |= flag_done;
}